

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

string * __thiscall
ctemplate::(anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modvals
          )

{
  ModifierAndValue *extraout_RDX;
  ctemplate *this_00;
  string one_mod;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (this_00 = *(ctemplate **)this; this_00 != *(ctemplate **)(this + 8); this_00 = this_00 + 0x18
      ) {
    PrettyPrintOneModifier_abi_cxx11_(&local_40,this_00,(ModifierAndValue *)modvals);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
    modvals = (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *)
              extraout_RDX;
  }
  return __return_storage_ptr__;
}

Assistant:

static string PrettyPrintTokenModifiers(
    const vector<ModifierAndValue>& modvals) {
  string out;
  for (vector<ModifierAndValue>::const_iterator it =
           modvals.begin(); it != modvals.end();  ++it) {
    string one_mod = PrettyPrintOneModifier(*it);
    out.append(one_mod);
  }
  return out;
}